

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyFixAnchors(TidyDocImpl *doc,Node *node,Bool wantName,Bool wantId)

{
  ctmbstr s1;
  ctmbstr s2;
  byte bVar1;
  bool bVar2;
  Bool BVar3;
  int iVar4;
  uint uVar5;
  Stack *stack;
  AttVal *av;
  AttVal *attr;
  Node *node_00;
  
  stack = prvTidynewStack(doc,0x10);
  if (node != (Node *)0x0) {
    do {
      node_00 = node->next;
      BVar3 = prvTidyIsAnchorElement(doc,node);
      if (BVar3 != no) {
        av = prvTidyAttrGetById(node,TidyAttr_NAME);
        attr = prvTidyAttrGetById(node,TidyAttr_ID);
        if (attr == (AttVal *)0x0 || av == (AttVal *)0x0) {
          if ((wantId == no) || (av == (AttVal *)0x0)) {
            bVar1 = 0;
            if (wantName == no) {
              bVar2 = false;
            }
            else {
              bVar2 = false;
              if (attr != (AttVal *)0x0) {
                uVar5 = prvTidyNodeAttributeVersions(node,TidyAttr_NAME);
                if ((doc->lexer->versionEmitted & uVar5) == 0) goto LAB_0014db89;
                prvTidyRepairAttrValue(doc,node,"name",attr->value);
                bVar1 = 1;
                goto LAB_0014db8b;
              }
            }
          }
          else {
            uVar5 = prvTidyNodeAttributeVersions(node,TidyAttr_ID);
            if ((doc->lexer->versionEmitted & uVar5) == 0) goto LAB_0014db89;
            BVar3 = prvTidyIsValidHTMLID(av->value);
            if (BVar3 == no) {
              uVar5 = 0x24d;
              goto LAB_0014db84;
            }
            prvTidyRepairAttrValue(doc,node,anon_var_dwarf_1aa34 + 0x2b,av->value);
            bVar2 = true;
            bVar1 = 0;
          }
        }
        else {
          s1 = av->value;
          s2 = attr->value;
          if (((s2 != (ctmbstr)0x0) != (s1 != (ctmbstr)0x0)) ||
             ((s1 != (ctmbstr)0x0 && s2 != (ctmbstr)0x0 &&
              (iVar4 = prvTidytmbstrcmp(s1,s2), iVar4 != 0)))) {
            uVar5 = 0x242;
LAB_0014db84:
            prvTidyReportAttrError(doc,node,av,uVar5);
          }
LAB_0014db89:
          bVar1 = 0;
LAB_0014db8b:
          bVar2 = false;
        }
        if (!(bool)((attr == (AttVal *)0x0 || wantId != no) |
                   (bVar1 ^ 1) & wantName != no & av == (AttVal *)0x0)) {
          if (wantName == no) {
            prvTidyRemoveAnchorByNode(doc,attr->value,node);
          }
          prvTidyRemoveAttribute(doc,node,attr);
        }
        if (((wantName == no) && (av != (AttVal *)0x0)) &&
           (attr != (AttVal *)0x0 || (wantId == no || bVar2))) {
          if (wantId == no) {
            prvTidyRemoveAnchorByNode(doc,av->value,node);
          }
          prvTidyRemoveAttribute(doc,node,av);
        }
      }
      if (node->content == (Node *)0x0) {
        if (node_00 == (Node *)0x0) {
          node_00 = prvTidypop(stack);
        }
      }
      else {
        prvTidypush(stack,node_00);
        node_00 = node->content;
      }
      node = node_00;
    } while (node_00 != (Node *)0x0);
  }
  prvTidyfreeStack(stack);
  return;
}

Assistant:

void TY_(FixAnchors)(TidyDocImpl* doc, Node *node, Bool wantName, Bool wantId)
{
    Stack *stack = TY_(newStack)(doc, 16);
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(IsAnchorElement)(doc, node))
        {
            AttVal *name = TY_(AttrGetById)(node, TidyAttr_NAME);
            AttVal *id = TY_(AttrGetById)(node, TidyAttr_ID);
            Bool hadName = name!=NULL;
            Bool hadId = id!=NULL;
            Bool IdEmitted = no;
            Bool NameEmitted = no;

            /* todo: how are empty name/id attributes handled? */

            if (name && id)
            {
                Bool NameHasValue = AttrHasValue(name);
                Bool IdHasValue = AttrHasValue(id);
                if ( (NameHasValue != IdHasValue) ||
                     (NameHasValue && IdHasValue &&
                     TY_(tmbstrcmp)(name->value, id->value) != 0 ) )
                    TY_(ReportAttrError)( doc, node, name, ID_NAME_MISMATCH);
            }
            else if (name && wantId)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_ID )
                    & doc->lexer->versionEmitted)
                {
                    if (TY_(IsValidHTMLID)(name->value))
                    {
                        TY_(RepairAttrValue)(doc, node, "id", name->value);
                        IdEmitted = yes;
                    }
                    else
                        TY_(ReportAttrError)(doc, node, name, INVALID_XML_ID);
                 }
            }
            else if (id && wantName)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_NAME )
                    & doc->lexer->versionEmitted)
                {
                    /* todo: do not assume id is valid */
                    TY_(RepairAttrValue)(doc, node, "name", id->value);
                    NameEmitted = yes;
                }
            }

            if (id && !wantId
                /* make sure that Name has been emitted if requested */
                && (hadName || !wantName || NameEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, id->value, node);
                TY_(RemoveAttribute)(doc, node, id);
            }

            if (name && !wantName
                /* make sure that Id has been emitted if requested */
                && (hadId || !wantId || IdEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, name->value, node);
                TY_(RemoveAttribute)(doc, node, name);
            }
        }

        if (node->content)
        {
            TY_(push)(stack, next);
            node = node->content;
            continue;
        }

        node = next ? next : TY_(pop)(stack);
    }
    TY_(freeStack)(stack);
}